

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.hpp
# Opt level: O2

Vector2<float> __thiscall
eos::render::clip_to_screen_space<float>
          (render *this,float clip_coord_x,float clip_coord_y,int screen_width,int screen_height)

{
  Vector2<float> VVar1;
  
  VVar1.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       (float)screen_height - (float)screen_height * 0.5 * (clip_coord_y + 1.0);
  VVar1.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       (float)screen_width * 0.5 * (clip_coord_x + 1.0);
  *(PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)this =
       VVar1.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
  return (Vector2<float>)
         VVar1.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

Eigen::Vector2<T> clip_to_screen_space(const T clip_coord_x, const T clip_coord_y, int screen_width,
                                       int screen_height)
{
    // Window transform:
    const T x_ss = (clip_coord_x + T(1)) * (screen_width / 2.0);
    const T y_ss =
        screen_height - (clip_coord_y + T(1)) *
                            (screen_height / 2.0); // also flip y; Qt: Origin top-left. OpenGL: bottom-left.
    return Eigen::Vector2<T>(x_ss, y_ss);
}